

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O0

void helper_set_dr_x86_64(CPUX86State *env,int reg,target_ulong t0)

{
  _Bool _Var1;
  int iVar2;
  uintptr_t unaff_retaddr;
  target_ulong t0_local;
  int reg_local;
  CPUX86State *env_local;
  
  switch(reg) {
  case 0:
  case 1:
  case 2:
  case 3:
    _Var1 = hw_breakpoint_enabled(env->dr[7],reg);
    if ((_Var1) && (iVar2 = hw_breakpoint_type(env->dr[7],reg), iVar2 != 2)) {
      hw_breakpoint_remove(env,reg);
      env->dr[reg] = t0;
      hw_breakpoint_insert(env,reg);
    }
    else {
      env->dr[reg] = t0;
    }
    break;
  case 4:
    if ((env->cr[4] & 8) != 0) goto switchD_00512c46_default;
  case 6:
    env->dr[6] = t0 | 0xffff0ff0;
    break;
  case 5:
    if ((env->cr[4] & 8) != 0) goto switchD_00512c46_default;
  case 7:
    cpu_x86_update_dr7_x86_64(env,(uint32_t)t0);
    break;
  default:
switchD_00512c46_default:
    raise_exception_err_ra_x86_64(env,6,0,unaff_retaddr);
  }
  return;
}

Assistant:

void helper_set_dr(CPUX86State *env, int reg, target_ulong t0)
{
    switch (reg) {
    case 0: case 1: case 2: case 3:
        if (hw_breakpoint_enabled(env->dr[7], reg)
            && hw_breakpoint_type(env->dr[7], reg) != DR7_TYPE_IO_RW) {
            hw_breakpoint_remove(env, reg);
            env->dr[reg] = t0;
            hw_breakpoint_insert(env, reg);
        } else {
            env->dr[reg] = t0;
        }
        return;
    case 4:
        if (env->cr[4] & CR4_DE_MASK) {
            break;
        }
        /* fallthru */
    case 6:
        env->dr[6] = t0 | DR6_FIXED_1;
        return;
    case 5:
        if (env->cr[4] & CR4_DE_MASK) {
            break;
        }
        /* fallthru */
    case 7:
        cpu_x86_update_dr7(env, t0);
        return;
    }
    raise_exception_err_ra(env, EXCP06_ILLOP, 0, GETPC());
}